

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O0

int X509v3_get_ext_by_OBJ(stack_st_X509_EXTENSION *x,ASN1_OBJECT *obj,int lastpos)

{
  int iVar1;
  size_t sVar2;
  X509_EXTENSION *pXVar3;
  X509_EXTENSION *ex;
  int n;
  int lastpos_local;
  ASN1_OBJECT *obj_local;
  stack_st_X509_EXTENSION *sk_local;
  
  if (x != (stack_st_X509_EXTENSION *)0x0) {
    ex._4_4_ = lastpos + 1;
    if (ex._4_4_ < 0) {
      ex._4_4_ = 0;
    }
    sVar2 = sk_X509_EXTENSION_num((stack_st_X509_EXTENSION *)x);
    for (; ex._4_4_ < (int)sVar2; ex._4_4_ = ex._4_4_ + 1) {
      pXVar3 = sk_X509_EXTENSION_value((stack_st_X509_EXTENSION *)x,(long)ex._4_4_);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)pXVar3->object,obj);
      if (iVar1 == 0) {
        return ex._4_4_;
      }
    }
  }
  return -1;
}

Assistant:

int X509v3_get_ext_by_OBJ(const STACK_OF(X509_EXTENSION) *sk,
                          const ASN1_OBJECT *obj, int lastpos) {
  if (sk == NULL) {
    return -1;
  }
  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }
  int n = (int)sk_X509_EXTENSION_num(sk);
  for (; lastpos < n; lastpos++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(sk, lastpos);
    if (OBJ_cmp(ex->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}